

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  int iVar2;
  ImGuiTabBar *pIVar3;
  
  iVar1 = this->FreeIdx;
  if (iVar1 == (this->Buf).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Buf,iVar1 + 1);
    iVar2 = this->FreeIdx + 1;
    pIVar3 = (this->Buf).Data;
  }
  else {
    pIVar3 = (this->Buf).Data;
    iVar2 = pIVar3[iVar1].Tabs.Size;
  }
  this->FreeIdx = iVar2;
  memset(pIVar3 + iVar1,0,0x98);
  pIVar3[iVar1].CurrFrameVisible = -1;
  pIVar3[iVar1].PrevFrameVisible = -1;
  pIVar3[iVar1].LastTabItemIdx = -1;
  return (this->Buf).Data + iVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }